

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proxy_functions_detail.hpp
# Opt level: O0

shared_ptr<signed_char>
chaiscript::dispatch::detail::
call_func<chaiscript::dispatch::detail::Fun_Caller<std::shared_ptr<signed_char>,chaiscript::Boxed_Number_const&>,std::shared_ptr<signed_char>,chaiscript::Boxed_Number_const&,0ul>
          (Boxed_Number *param_1,undefined8 param_2,undefined8 param_3,
          vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_> *param_4)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<signed_char> sVar1;
  Type_Conversions_State *in_stack_00000090;
  Boxed_Value *in_stack_00000098;
  Boxed_Number *this;
  
  this = param_1;
  std::vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>::operator[]
            (param_4,0);
  boxed_cast<chaiscript::Boxed_Number_const&>(in_stack_00000098,in_stack_00000090);
  Fun_Caller<std::shared_ptr<signed_char>,chaiscript::Boxed_Number_const&>::operator()
            ((Fun_Caller<std::shared_ptr<signed_char>,_const_chaiscript::Boxed_Number_&> *)this,
             param_1);
  Boxed_Number::~Boxed_Number((Boxed_Number *)0x3a8da9);
  sVar1.super___shared_ptr<signed_char,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar1.super___shared_ptr<signed_char,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)param_1
  ;
  return (shared_ptr<signed_char>)sVar1.super___shared_ptr<signed_char,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Ret call_func(const chaiscript::dispatch::detail::Function_Signature<Ret (Params...)> &, Indexes<I...>, const Callable &f,
            const std::vector<Boxed_Value> &params, const Type_Conversions_State &t_conversions)
        {
          (void)params; (void)t_conversions;
          return f(boxed_cast<Params>(params[I], &t_conversions)...);
        }